

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollFromPosY(ImGuiWindow *window,float local_y,float center_y_ratio)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  ImGuiWindow *unaff_retaddr;
  
  if (in_XMM1_Da < 0.0 || 1.0 < in_XMM1_Da) {
    __assert_fail("center_y_ratio >= 0.0f && center_y_ratio <= 1.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1eab,"void ImGui::SetScrollFromPosY(ImGuiWindow *, float, float)");
  }
  fVar1 = ImGuiWindow::TitleBarHeight(unaff_retaddr);
  fVar2 = ImGuiWindow::MenuBarHeight(unaff_retaddr);
  *(float *)(in_RDI + 0x70) =
       (float)(int)((in_XMM0_Da - (fVar1 + fVar2)) + *(float *)(in_RDI + 0x60));
  *(float *)(in_RDI + 0x78) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

void ImGui::SetScrollFromPosY(ImGuiWindow* window, float local_y, float center_y_ratio)
{
    IM_ASSERT(center_y_ratio >= 0.0f && center_y_ratio <= 1.0f);
    local_y -= window->TitleBarHeight() + window->MenuBarHeight(); // FIXME: Would be nice to have a more standardized access to our scrollable/client rect
    window->ScrollTarget.y = IM_FLOOR(local_y + window->Scroll.y); // Convert local position to scroll offset
    window->ScrollTargetCenterRatio.y = center_y_ratio;
    window->ScrollTargetEdgeSnapDist.y = 0.0f;
}